

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::destroy_attribute(xml_attribute_struct *a,xml_allocator *alloc)

{
  size_t in_RSI;
  ulong *in_RDI;
  xml_allocator *unaff_retaddr;
  char_t *in_stack_00000018;
  xml_allocator *in_stack_00000020;
  xml_memory_page *in_stack_ffffffffffffffe8;
  
  if ((*in_RDI & 0x20) != 0) {
    xml_allocator::deallocate_string(in_stack_00000020,in_stack_00000018);
  }
  if ((*in_RDI & 0x10) != 0) {
    xml_allocator::deallocate_string(in_stack_00000020,in_stack_00000018);
  }
  xml_allocator::deallocate_memory(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

inline void destroy_attribute(xml_attribute_struct* a, xml_allocator& alloc)
	{
		if (a->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(a->name);

		if (a->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(a->value);

		alloc.deallocate_memory(a, sizeof(xml_attribute_struct), PUGI_IMPL_GETPAGE(a));
	}